

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int convertCompoundSelectToSubquery(Walker *pWalker,Select *p)

{
  Parse *pParse;
  sqlite3 *db;
  Expr **ppEVar1;
  undefined1 uVar2;
  LogEst LVar3;
  u32 uVar4;
  ExprList_item *pEVar5;
  Select *pSVar6;
  SrcList *pSVar7;
  Expr *pExpr;
  ExprList *pEVar8;
  int iVar9;
  long lVar10;
  Select *pSVar11;
  Select *pSVar12;
  byte bVar13;
  Token dummy;
  Token local_58;
  Token local_40;
  
  bVar13 = 0;
  if (p->pPrior == (Select *)0x0) {
    return 0;
  }
  pEVar8 = p->pOrderBy;
  if (pEVar8 == (ExprList *)0x0) {
    return 0;
  }
  pSVar6 = p;
  while ((pSVar6->op == 0x8a || (pSVar6->op == 0x87))) {
    pSVar6 = pSVar6->pPrior;
    if (pSVar6 == (Select *)0x0) {
      return 0;
    }
  }
  if (pEVar8->a[0].u.x.iOrderByCol != 0) {
    return 0;
  }
  iVar9 = pEVar8->nExpr + 1;
  pEVar5 = pEVar8->a + ((ulong)(uint)pEVar8->nExpr - 1);
  do {
    iVar9 = iVar9 + -1;
    if (iVar9 < 1) {
      return 0;
    }
    ppEVar1 = &pEVar5->pExpr;
    pEVar5 = pEVar5 + -1;
  } while (((*ppEVar1)->flags & 0x200) == 0);
  pParse = pWalker->pParse;
  db = pParse->db;
  pSVar6 = (Select *)sqlite3DbMallocZero(db,0x80);
  iVar9 = 2;
  if (pSVar6 != (Select *)0x0) {
    local_58.z = (char *)0x0;
    local_58.n = 0;
    local_58._12_4_ = 0;
    pSVar7 = sqlite3SrcListAppendFromTerm
                       (pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0,&local_58,pSVar6,
                        (OnOrUsing *)0x0);
    if (pSVar7 != (SrcList *)0x0) {
      pSVar11 = p;
      pSVar12 = pSVar6;
      for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
        uVar2 = pSVar11->field_0x1;
        LVar3 = pSVar11->nSelectRow;
        uVar4 = pSVar11->selFlags;
        pSVar12->op = pSVar11->op;
        pSVar12->field_0x1 = uVar2;
        pSVar12->nSelectRow = LVar3;
        pSVar12->selFlags = uVar4;
        pSVar11 = (Select *)((long)pSVar11 + (ulong)bVar13 * -0x10 + 8);
        pSVar12 = (Select *)((long)pSVar12 + (ulong)bVar13 * -0x10 + 8);
      }
      p->pSrc = pSVar7;
      local_40.z = (char *)0x0;
      local_40.n = 0;
      pExpr = sqlite3ExprAlloc(db,0xb4,&local_40,0);
      pEVar8 = sqlite3ExprListAppendNew(pParse->db,pExpr);
      p->pEList = pEVar8;
      p->op = 0x8a;
      p->pWhere = (Expr *)0x0;
      pSVar6->pOrderBy = (ExprList *)0x0;
      pSVar6->pGroupBy = (ExprList *)0x0;
      pSVar6->pHaving = (Expr *)0x0;
      p->pWith = (With *)0x0;
      p->pWinDefn = (Window *)0x0;
      p->pPrior = (Select *)0x0;
      p->pNext = (Select *)0x0;
      p->selFlags = p->selFlags & 0xfffefeff | 0x10000;
      pSVar6->pPrior->pNext = pSVar6;
      pSVar6->pLimit = (Expr *)0x0;
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

static int convertCompoundSelectToSubquery(Walker *pWalker, Select *p){
  int i;
  Select *pNew;
  Select *pX;
  sqlite3 *db;
  struct ExprList_item *a;
  SrcList *pNewSrc;
  Parse *pParse;
  Token dummy;

  if( p->pPrior==0 ) return WRC_Continue;
  if( p->pOrderBy==0 ) return WRC_Continue;
  for(pX=p; pX && (pX->op==TK_ALL || pX->op==TK_SELECT); pX=pX->pPrior){}
  if( pX==0 ) return WRC_Continue;
  a = p->pOrderBy->a;
#ifndef SQLITE_OMIT_WINDOWFUNC
  /* If iOrderByCol is already non-zero, then it has already been matched
  ** to a result column of the SELECT statement. This occurs when the
  ** SELECT is rewritten for window-functions processing and then passed
  ** to sqlite3SelectPrep() and similar a second time. The rewriting done
  ** by this function is not required in this case. */
  if( a[0].u.x.iOrderByCol ) return WRC_Continue;
#endif
  for(i=p->pOrderBy->nExpr-1; i>=0; i--){
    if( a[i].pExpr->flags & EP_Collate ) break;
  }
  if( i<0 ) return WRC_Continue;

  /* If we reach this point, that means the transformation is required. */

  pParse = pWalker->pParse;
  db = pParse->db;
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew) );
  if( pNew==0 ) return WRC_Abort;
  memset(&dummy, 0, sizeof(dummy));
  pNewSrc = sqlite3SrcListAppendFromTerm(pParse,0,0,0,&dummy,pNew,0);
  if( pNewSrc==0 ) return WRC_Abort;
  *pNew = *p;
  p->pSrc = pNewSrc;
  p->pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db, TK_ASTERISK, 0));
  p->op = TK_SELECT;
  p->pWhere = 0;
  pNew->pGroupBy = 0;
  pNew->pHaving = 0;
  pNew->pOrderBy = 0;
  p->pPrior = 0;
  p->pNext = 0;
  p->pWith = 0;
#ifndef SQLITE_OMIT_WINDOWFUNC
  p->pWinDefn = 0;
#endif
  p->selFlags &= ~SF_Compound;
  assert( (p->selFlags & SF_Converted)==0 );
  p->selFlags |= SF_Converted;
  assert( pNew->pPrior!=0 );
  pNew->pPrior->pNext = pNew;
  pNew->pLimit = 0;
  return WRC_Continue;
}